

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::runContinuation(QFutureInterfaceBase *this)

{
  bool bVar1;
  ContinuationState CVar2;
  function<void_(const_QFutureInterfaceBase_&)> *in_RDI;
  long in_FS_OFFSET;
  type fn;
  QMutexLocker<QBasicMutex> lock;
  function<void_(const_QFutureInterfaceBase_&)> *in_stack_ffffffffffffff98;
  _Any_data *in_stack_ffffffffffffffa0;
  _Any_data local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffffa0,
             (QBasicMutex *)in_stack_ffffffffffffff98);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_QFutureInterfaceBase_&)> *)0x6e0e14);
  if ((bVar1) &&
     ((*(byte *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xd8) & 1) == 0))
  {
    if (*(long *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xa8) != 0) {
      *(undefined8 *)
       (*(long *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xa8) + 0xb0) =
           0;
    }
    *(undefined1 *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xd8) = 1;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38._M_unused._M_object = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffffa0 = &local_38;
    std::function<void_(const_QFutureInterfaceBase_&)>::function
              ((function<void_(const_QFutureInterfaceBase_&)> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    QMutexLocker<QBasicMutex>::unlock((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffffa0);
    std::function<void_(const_QFutureInterfaceBase_&)>::operator()
              ((function<void_(const_QFutureInterfaceBase_&)> *)in_stack_ffffffffffffffa0,
               (QFutureInterfaceBase *)in_stack_ffffffffffffff98);
    QMutexLocker<QBasicMutex>::relock((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffffa0);
    CVar2 = std::atomic::operator_cast_to_ContinuationState
                      ((atomic<QFutureInterfaceBasePrivate::ContinuationState> *)0x6e0edd);
    if (CVar2 != Cleaned) {
      std::function<void_(const_QFutureInterfaceBase_&)>::operator=
                (in_RDI,(function<void_(const_QFutureInterfaceBase_&)> *)in_stack_ffffffffffffffa0);
    }
    std::function<void_(const_QFutureInterfaceBase_&)>::~function
              ((function<void_(const_QFutureInterfaceBase_&)> *)0x6e0f33);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::runContinuation() const
{
    QMutexLocker lock(&d->continuationMutex);
    if (d->continuation && !d->continuationExecuted) {
        // If we run the next continuation, then this future is concluded, so
        // we wouldn't need to revisit it in the cancelChain()
        if (d->continuationData)
            d->continuationData->nonConcludedParent = nullptr;
        // Save the continuation in a local function, to avoid calling
        // a null std::function below, in case cleanContinuation() is
        // called from some other thread right after unlock() below.
        d->continuationExecuted = true;
        auto fn = std::move(d->continuation);
        lock.unlock();
        fn(*this);

        lock.relock();
        // Unless the continuation has been cleaned earlier, we have to
        // store the move-only continuation, to guarantee that the associated
        // future's data stays alive.
        if (d->continuationState != QFutureInterfaceBasePrivate::Cleaned)
            d->continuation = std::move(fn);
    }
}